

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_combiner.cpp
# Opt level: O2

FilterPushdownResult __thiscall
duckdb::FilterCombiner::TryPushdownConstantFilter
          (FilterCombiner *this,TableFilterSet *table_filters,
          vector<duckdb::ColumnIndex,_true> *column_ids,column_t expr_id,
          vector<duckdb::FilterCombiner::ExpressionValueInformation,_true> *info_list)

{
  string *__lhs;
  ExpressionType EVar1;
  Value *pVVar2;
  bool bVar3;
  reference type;
  BoundFunctionExpression *pBVar4;
  const_reference this_00;
  Expression *this_01;
  BoundColumnRefExpression *pBVar5;
  const_reference pvVar6;
  iterator iVar7;
  Value *args_1;
  pointer *__ptr;
  FilterPushdownResult FVar8;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_98;
  long *local_90;
  TableFilter *local_88;
  iterator local_80;
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::vector<std::reference_wrapper<duckdb::Expression>,true>>,std::_Select1st<std::pair<unsigned_long_const,duckdb::vector<std::reference_wrapper<duckdb::Expression>,true>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::vector<std::reference_wrapper<duckdb::Expression>,true>>>>
  *local_78;
  vector<duckdb::ColumnIndex,_true> *local_70;
  reference local_68;
  unsigned_long equiv_set;
  column_t expr_id_local;
  ColumnIndex column_index;
  
  if ((info_list->
      super_vector<duckdb::FilterCombiner::ExpressionValueInformation,_std::allocator<duckdb::FilterCombiner::ExpressionValueInformation>_>
      ).
      super__Vector_base<duckdb::FilterCombiner::ExpressionValueInformation,_std::allocator<duckdb::FilterCombiner::ExpressionValueInformation>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (info_list->
      super_vector<duckdb::FilterCombiner::ExpressionValueInformation,_std::allocator<duckdb::FilterCombiner::ExpressionValueInformation>_>
      ).
      super__Vector_base<duckdb::FilterCombiner::ExpressionValueInformation,_std::allocator<duckdb::FilterCombiner::ExpressionValueInformation>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    FVar8 = NO_PUSHDOWN;
  }
  else {
    local_70 = column_ids;
    expr_id_local = expr_id;
    type = vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>::get<true>(info_list,0);
    bVar3 = TypeSupportsConstantFilter((LogicalType *)type);
    FVar8 = NO_PUSHDOWN;
    if ((bVar3) && ((byte)(type->comparison_type - COMPARE_BOUNDARY_START) < 6)) {
      local_80 = ::std::
                 _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>_>_>
                 ::find(&(this->equivalence_map)._M_t,&expr_id_local);
      FVar8 = NO_PUSHDOWN;
      if ((long)local_80._M_node[1]._M_left - (long)local_80._M_node[1]._M_parent == 8) {
        FVar8 = NO_PUSHDOWN;
        local_78 = (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::vector<std::reference_wrapper<duckdb::Expression>,true>>,std::_Select1st<std::pair<unsigned_long_const,duckdb::vector<std::reference_wrapper<duckdb::Expression>,true>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::vector<std::reference_wrapper<duckdb::Expression>,true>>>>
                    *)&this->equivalence_map;
        local_68 = vector<std::reference_wrapper<duckdb::Expression>,_true>::get<true>
                             ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)
                              &local_80._M_node[1]._M_parent,0);
        equiv_set = *(unsigned_long *)(local_80._M_node + 1);
        column_index.index = 0xffffffffffffffff;
        column_index.child_indexes.
        super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
        super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        column_index.child_indexes.
        super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
        super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        column_index.child_indexes.
        super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
        super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        this_01 = local_68->_M_data;
        while (EVar1 = (this_01->super_BaseExpression).type, EVar1 == BOUND_FUNCTION) {
          pBVar4 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                             (&this_01->super_BaseExpression);
          __lhs = &(pBVar4->function).super_BaseScalarFunction.super_SimpleFunction.super_Function.
                   name;
          bVar3 = ::std::operator==(__lhs,"struct_extract");
          if (!bVar3) {
            bVar3 = ::std::operator==(__lhs,"struct_extract_at");
            if (!bVar3) goto LAB_01255850;
          }
          this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    ::get<true>(&pBVar4->children,0);
          this_01 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator*(this_00);
        }
        if (EVar1 == BOUND_COLUMN_REF) {
          pBVar5 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>
                             (&this_01->super_BaseExpression);
          pvVar6 = vector<duckdb::ColumnIndex,_true>::get<true>
                             (local_70,(pBVar5->binding).column_index);
          ColumnIndex::operator=(&column_index,pvVar6);
          iVar7 = ::std::
                  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>_>_>
                  ::find(&(this->constant_values)._M_t,&equiv_set);
          pVVar2 = (Value *)iVar7._M_node[1]._M_left;
          for (args_1 = (Value *)iVar7._M_node[1]._M_parent; args_1 != pVVar2;
              args_1 = (Value *)&args_1[1].type_.type_info_) {
            make_uniq<duckdb::ConstantFilter,duckdb::ExpressionType&,duckdb::Value&>
                      ((duckdb *)&local_88,(ExpressionType *)(args_1 + 1),args_1);
            local_98._M_head_impl = local_88;
            local_88 = (TableFilter *)0x0;
            PushDownFilterIntoExpr
                      ((duckdb *)&local_90,local_68->_M_data,
                       (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                        *)&local_98);
            TableFilterSet::PushFilter
                      (table_filters,&column_index,
                       (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                        *)&local_90);
            if (local_90 != (long *)0x0) {
              (**(code **)(*local_90 + 8))();
            }
            local_90 = (long *)0x0;
            if (local_98._M_head_impl != (TableFilter *)0x0) {
              (*(local_98._M_head_impl)->_vptr_TableFilter[1])();
            }
            local_98._M_head_impl = (TableFilter *)0x0;
            if (local_88 != (TableFilter *)0x0) {
              (*local_88->_vptr_TableFilter[1])();
            }
          }
          ::std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::vector<std::reference_wrapper<duckdb::Expression>,true>>,std::_Select1st<std::pair<unsigned_long_const,duckdb::vector<std::reference_wrapper<duckdb::Expression>,true>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::vector<std::reference_wrapper<duckdb::Expression>,true>>>>
          ::erase_abi_cxx11_(local_78,local_80);
          FVar8 = PUSHED_DOWN_FULLY;
        }
LAB_01255850:
        ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::~vector
                  (&column_index.child_indexes.
                    super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>);
      }
    }
  }
  return FVar8;
}

Assistant:

FilterPushdownResult FilterCombiner::TryPushdownConstantFilter(TableFilterSet &table_filters,
                                                               const vector<ColumnIndex> &column_ids, column_t expr_id,
                                                               vector<ExpressionValueInformation> &info_list) {
	if (info_list.empty()) {
		// no constants - already removed
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	auto &constant_info = info_list[0];
	// check if the type is supported
	if (!TypeSupportsConstantFilter(constant_info.constant.type())) {
		// not supported
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	if (!SupportedFilterComparison(constant_info.comparison_type)) {
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	//! Here we check if these filters are column references
	auto filter_exp = equivalence_map.find(expr_id);
	if (filter_exp->second.size() != 1) {
		return FilterPushdownResult::NO_PUSHDOWN;
	}

	auto &expr = filter_exp->second[0];
	auto equiv_set = filter_exp->first;

	// Try to get the column index, either from bound column ref, or a column ref nested inside of a
	// struct_extract call
	ColumnIndex column_index;
	if (!TryGetBoundColumnIndex(column_ids, expr, column_index)) {
		return FilterPushdownResult::NO_PUSHDOWN;
	}

	auto &constant_list = constant_values.find(equiv_set)->second;
	for (auto &constant_cmp : constant_list) {
		auto constant_filter = make_uniq<ConstantFilter>(constant_cmp.comparison_type, constant_cmp.constant);
		table_filters.PushFilter(column_index, PushDownFilterIntoExpr(expr, std::move(constant_filter)));
	}
	equivalence_map.erase(filter_exp);
	return FilterPushdownResult::PUSHED_DOWN_FULLY;
}